

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionType.cpp
# Opt level: O3

int __thiscall
hdc::FunctionType::clone
          (FunctionType *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  pointer *pppTVar1;
  iterator __position;
  int iVar2;
  FunctionType *this_00;
  pointer ppTVar3;
  undefined4 extraout_var;
  ulong uVar4;
  Type *local_30;
  
  this_00 = (FunctionType *)operator_new(0x30);
  FunctionType(this_00);
  ppTVar3 = (this->subtypes).super__Vector_base<hdc::Type_*,_std::allocator<hdc::Type_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->subtypes).super__Vector_base<hdc::Type_*,_std::allocator<hdc::Type_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar3) {
    uVar4 = 0;
    do {
      iVar2 = (*(ppTVar3[uVar4]->super_ASTNode)._vptr_ASTNode[3])();
      local_30 = (Type *)CONCAT44(extraout_var,iVar2);
      __position._M_current =
           (this_00->subtypes).super__Vector_base<hdc::Type_*,_std::allocator<hdc::Type_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_00->subtypes).super__Vector_base<hdc::Type_*,_std::allocator<hdc::Type_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<hdc::Type*,std::allocator<hdc::Type*>>::_M_realloc_insert<hdc::Type*>
                  ((vector<hdc::Type*,std::allocator<hdc::Type*>> *)&this_00->subtypes,__position,
                   &local_30);
      }
      else {
        *__position._M_current = local_30;
        pppTVar1 = &(this_00->subtypes).
                    super__Vector_base<hdc::Type_*,_std::allocator<hdc::Type_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      uVar4 = uVar4 + 1;
      ppTVar3 = (this->subtypes).super__Vector_base<hdc::Type_*,_std::allocator<hdc::Type_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->subtypes).
                                   super__Vector_base<hdc::Type_*,_std::allocator<hdc::Type_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3));
  }
  return (int)this_00;
}

Assistant:

Type *FunctionType::clone() {
    FunctionType* cloned = new FunctionType();

    for (int i = 0; i < subtypes.size(); ++i) {
        cloned->subtypes.push_back(subtypes[i]->clone());
    }

    return cloned;
}